

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int VP8EncAnalyze(VP8Encoder *enc)

{
  uint uVar1;
  long *in_RDI;
  SegmentJob side_job;
  SegmentJob main_job;
  WebPWorkerInterface *worker_interface;
  int do_mt;
  int kMinSplitRow;
  int split_row;
  int total_mb;
  int last_row;
  int do_segments;
  int ok;
  SegmentJob *in_stack_ffffffffffffd928;
  undefined6 in_stack_ffffffffffffd930;
  undefined1 in_stack_ffffffffffffd936;
  undefined1 uVar2;
  undefined1 uVar3;
  WebPWorker local_26c8 [24];
  uint32_t *in_stack_ffffffffffffddb8;
  VP8Encoder *in_stack_ffffffffffffddc0;
  SegmentJob local_1380;
  WebPWorkerInterface *local_38;
  uint local_2c;
  undefined4 local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  long *local_10;
  uint local_4;
  
  local_14 = 1;
  uVar3 = true;
  if ((*(int *)(*in_RDI + 0x50) == 0) && (uVar3 = true, (int)in_RDI[4] < 2)) {
    uVar3 = (int)in_RDI[0xb88] < 2;
  }
  local_18 = (uint)(byte)uVar3;
  local_10 = in_RDI;
  if (local_18 == 0) {
    ResetAllMBInfo((VP8Encoder *)
                   CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffd936,in_stack_ffffffffffffd930)));
  }
  else {
    local_1c = *(int *)((long)in_RDI + 0x34);
    local_20 = local_1c * (int)in_RDI[6];
    local_24 = local_1c * 9 + 0xf >> 4;
    local_28 = 2;
    uVar2 = 0 < (int)in_RDI[0xb8a] && 1 < local_24;
    local_2c = (uint)(byte)uVar2;
    local_38 = WebPGetWorkerInterface();
    if (local_2c == 0) {
      InitSegmentJob((VP8Encoder *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd930)),
                     in_stack_ffffffffffffd928,0,0x16dcec);
      (*local_38->Execute)(&local_1380.worker);
      uVar1 = (*local_38->Sync)(&local_1380.worker);
      local_14 = uVar1 & local_14;
    }
    else {
      InitSegmentJob((VP8Encoder *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd930)),
                     in_stack_ffffffffffffd928,0,0x16dbe4);
      InitSegmentJob((VP8Encoder *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd930)),
                     in_stack_ffffffffffffd928,0,0x16dc04);
      uVar1 = (*local_38->Reset)(local_26c8);
      local_14 = uVar1 & local_14;
      if (local_14 != 0) {
        (*local_38->Launch)(local_26c8);
        (*local_38->Execute)(&local_1380.worker);
        uVar1 = (*local_38->Sync)(local_26c8);
        local_14 = uVar1 & local_14;
        uVar1 = (*local_38->Sync)(&local_1380.worker);
        local_14 = uVar1 & local_14;
      }
      (*local_38->End)(local_26c8);
      if (local_14 != 0) {
        MergeJobs((SegmentJob *)local_26c8,&local_1380);
      }
    }
    (*local_38->End)(&local_1380.worker);
    if (local_14 != 0) {
      *(int *)((long)local_10 + 0xe04) = local_1380.alpha / local_20;
      *(int *)(local_10 + 0x1c1) = local_1380.uv_alpha / local_20;
      AssignSegments(in_stack_ffffffffffffddc0,(int *)in_stack_ffffffffffffddb8);
    }
  }
  if (local_14 == 0) {
    local_4 = WebPEncodingSetError((WebPPicture *)local_10[1],VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr.num_segments > 1) ||
      (enc->method <= 1);  // for method 0 - 1, we need preds[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h;
    const int total_mb = last_row * enc->mb_w;
#ifdef WEBP_USE_THREAD
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
#ifdef WEBP_USE_THREAD
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
#endif  // WEBP_USE_THREAD
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha = main_job.alpha / total_mb;
      enc->uv_alpha = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  if (!ok) {
    return WebPEncodingSetError(enc->pic,
                                VP8_ENC_ERROR_OUT_OF_MEMORY);  // imprecise
  }
  return ok;
}